

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O1

Availability __thiscall
anon_unknown.dwarf_dbfaef::Satisfier::Sign
          (Satisfier *this,CPubKey *key,vector<unsigned_char,_std::allocator<unsigned_char>_> *sig)

{
  MiniscriptContext MVar1;
  size_type sVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  _Base_ptr __x;
  Availability AVar5;
  long in_FS_OFFSET;
  key_type local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.m_keydata.super_base_blob<256U>.m_data._M_elems._4_4_ = *(uint *)(key->vch + 0x1d);
  local_48.m_keydata.super_base_blob<256U>.m_data._M_elems._0_4_ = PK;
  sVar2 = std::
          set<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>,_std::less<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>,_std::allocator<std::pair<(anonymous_namespace)::ChallengeType,_unsigned_int>_>_>
          ::count(&this->supported,(key_type *)&local_48);
  AVar5 = NO;
  if (sVar2 != 0) {
    MVar1 = (this->super_KeyConverter).m_script_ctx;
    AVar5 = NO;
    if (MVar1 == P2WSH) {
      cVar4 = std::
              _Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find((_Rb_tree<CPubKey,_std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)((anonymous_namespace)::g_testdata + 0xa8),key);
      if (cVar4._M_node == (_Base_ptr)((anonymous_namespace)::g_testdata + 0xb0)) goto LAB_00481d05;
      __x = (_Base_ptr)&cVar4._M_node[3]._M_parent;
    }
    else {
      if (MVar1 != TAPSCRIPT) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                      ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
      }
      local_48.m_keydata.super_base_blob<256U>.m_data._M_elems._0_8_ = *(key_type *)(key->vch + 1);
      local_48.m_keydata.super_base_blob<256U>.m_data._M_elems._8_8_ = *(undefined8 *)(key->vch + 9)
      ;
      local_48.m_keydata.super_base_blob<256U>.m_data._M_elems._16_8_ =
           *(undefined8 *)(key->vch + 0x11);
      local_48.m_keydata.super_base_blob<256U>.m_data._M_elems._24_8_ =
           *(undefined8 *)(key->vch + 0x19);
      cVar3 = std::
              _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find((_Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      *)((anonymous_namespace)::g_testdata + 0xd8),&local_48);
      if (cVar3._M_node == (_Base_ptr)((anonymous_namespace)::g_testdata + 0xe0)) goto LAB_00481d05;
      __x = cVar3._M_node + 2;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              (sig,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)__x);
    AVar5 = YES;
  }
LAB_00481d05:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return AVar5;
  }
  __stack_chk_fail();
}

Assistant:

miniscript::Availability Sign(const CPubKey& key, std::vector<unsigned char>& sig) const {
        if (supported.count(Challenge(ChallengeType::PK, ChallengeNumber(key)))) {
            if (!miniscript::IsTapscript(m_script_ctx)) {
                auto it = g_testdata->signatures.find(key);
                if (it == g_testdata->signatures.end()) return miniscript::Availability::NO;
                sig = it->second;
            } else {
                auto it = g_testdata->schnorr_signatures.find(XOnlyPubKey{key});
                if (it == g_testdata->schnorr_signatures.end()) return miniscript::Availability::NO;
                sig = it->second;
            }
            return miniscript::Availability::YES;
        }
        return miniscript::Availability::NO;
    }